

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::StringWriter::getFileExtensionWithDot_abi_cxx11_
          (string *__return_storage_ptr__,StringWriter *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->ext);
  return __return_storage_ptr__;
}

Assistant:

std::string StringWriter::getFileExtensionWithDot() const
    {
        return ext;
    }